

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colourspaces.c
# Opt level: O1

khr_df_primaries_e findMapping(Primaries *p,float latitude)

{
  float fVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    fVar1 = *(float *)((long)&primaryMap[0].primaries.Rx + lVar2);
    if ((fVar1 - p->Rx <= latitude) && (p->Rx - fVar1 <= latitude)) {
      fVar1 = *(float *)((long)&primaryMap[0].primaries.Gx + lVar2);
      if ((fVar1 - p->Gx <= latitude) && (p->Gx - fVar1 <= latitude)) {
        fVar1 = *(float *)((long)&primaryMap[0].primaries.Bx + lVar2);
        if ((fVar1 - p->Bx <= latitude) && (p->Bx - fVar1 <= latitude)) {
          fVar1 = *(float *)((long)&primaryMap[0].primaries.Wx + lVar2);
          if ((fVar1 - p->Wx <= latitude) && (p->Wx - fVar1 <= latitude)) {
            return *(khr_df_primaries_e *)((long)&primaryMap[0].dfPrimaryEnum + lVar2);
          }
        }
      }
    }
    lVar2 = lVar2 + 0x24;
    if (lVar2 == 0x18c) {
      return KHR_DF_PRIMARIES_UNSPECIFIED;
    }
  } while( true );
}

Assistant:

khr_df_primaries_e findMapping(const Primaries *p, float latitude) {
    unsigned int i;
    for (i = 0; i < sizeof(primaryMap)/sizeof(sPrimaryMapping); ++i) {
        if (primaryMap[i].primaries.Rx - p->Rx <= latitude && p->Rx - primaryMap[i].primaries.Rx <= latitude &&
            primaryMap[i].primaries.Gx - p->Gx <= latitude && p->Gx - primaryMap[i].primaries.Gx <= latitude &&
            primaryMap[i].primaries.Bx - p->Bx <= latitude && p->Bx - primaryMap[i].primaries.Bx <= latitude &&
            primaryMap[i].primaries.Wx - p->Wx <= latitude && p->Wx - primaryMap[i].primaries.Wx <= latitude) {
            return primaryMap[i].dfPrimaryEnum;
        }
    }
    /* No match */
    return KHR_DF_PRIMARIES_UNSPECIFIED;
}